

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O2

void anon_unknown.dwarf_454c::gcd_1_thread(void)

{
  int iVar1;
  int a;
  int b;
  int iVar2;
  Monitor perfmon_scope_monitor_0;
  Monitor perfmon_scope_monitor_1;
  Monitor local_50;
  Monitor local_40;
  
  if ((anonymous_namespace)::gcd_1_thread()::$_0::operator()()::perfmon_internal_index_result ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::gcd_1_thread()::$_0::operator()()::
                                 perfmon_internal_index_result);
    if (iVar1 != 0) {
      (anonymous_namespace)::gcd_1_thread()::$_0::operator()()::perfmon_internal_index_result =
           perfmon::internal::GetCounterIndex((char *)0x103847);
      __cxa_guard_release(&(anonymous_namespace)::gcd_1_thread()::$_0::operator()()::
                           perfmon_internal_index_result);
    }
  }
  local_50.counter_index_ =
       (anonymous_namespace)::gcd_1_thread()::$_0::operator()()::perfmon_internal_index_result;
  local_50.start_tick_ = rdtsc();
  iVar2 = 0;
  iVar1 = N;
  for (a = 0; a < iVar1; a = a + 1) {
    for (b = 0; b < iVar1; b = b + 1) {
      if ((anonymous_namespace)::gcd_1_thread()::$_1::operator()()::perfmon_internal_index_result ==
          '\0') {
        iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::gcd_1_thread()::$_1::operator()()::
                                     perfmon_internal_index_result);
        if (iVar1 != 0) {
          (anonymous_namespace)::gcd_1_thread()::$_1::operator()()::perfmon_internal_index_result =
               perfmon::internal::GetCounterIndex((char *)0x1037f1);
          __cxa_guard_release(&(anonymous_namespace)::gcd_1_thread()::$_1::operator()()::
                               perfmon_internal_index_result);
        }
      }
      local_40.counter_index_ =
           (anonymous_namespace)::gcd_1_thread()::$_1::operator()()::perfmon_internal_index_result;
      local_40.start_tick_ = rdtsc();
      iVar1 = gcd(a,b);
      iVar2 = iVar2 + iVar1;
      perfmon::internal::Monitor::~Monitor(&local_40);
      iVar1 = N;
    }
  }
  LOCK();
  (anonymous_namespace)::global_gcd_1_result = (anonymous_namespace)::global_gcd_1_result + iVar2;
  UNLOCK();
  perfmon::internal::Monitor::~Monitor(&local_50);
  return;
}

Assistant:

void gcd_1_thread() {
  PERFMON_SCOPE("gcd_1_thread");
  int result = 0;
  for (int i = 0; i < N; ++i) {
    for (int j = 0; j < N; ++j) {
      PERFMON_SCOPE("congestion_point");
      result += gcd(i, j);
    }
  }
  global_gcd_1_result += result;
}